

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O1

Fl_Double_Window * make_project_window(void)

{
  uint *puVar1;
  Fl_Input *pFVar2;
  Fl_Check_Button *pFVar3;
  Fl_Choice *this;
  Fl_Int_Input *pFVar4;
  Fl_Double_Window *pFVar5;
  Fl_Button *this_00;
  Fl_Tabs *this_01;
  Fl_Group *pFVar6;
  Fl_Box *this_02;
  Fl_Widget *pFVar7;
  
  pFVar5 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar5,399,0xfc,"Project Settings");
  project_window = pFVar5;
  this_00 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_00,0x148,0xd8,0x3c,0x19,"Close");
  Fl_Widget::tooltip((Fl_Widget *)this_00,"Close this dialog.");
  (this_00->super_Fl_Widget).callback_ = cb_Close;
  this_01 = (Fl_Tabs *)operator_new(200);
  Fl_Tabs::Fl_Tabs(this_01,10,10,0x17a,0xc3,(char *)0x0);
  (this_01->super_Fl_Group).super_Fl_Widget.color2_ = 0xc;
  pFVar6 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar6,10,0x24,0x17a,0xa9,"Output");
  (*(pFVar6->super_Fl_Widget)._vptr_Fl_Widget[6])(pFVar6);
  this_02 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(this_02,0x14,0x31,0x154,0x31,
                 "Use \"name.ext\" to set a file name or just \".ext\" to set extension.");
  (this_02->super_Fl_Widget).label_.align_ = 0x94;
  pFVar7 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar7,0x77,0x67,0xfc,0x14,"Header File:");
  header_file_input = (Fl_Input *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"The name of the generated header file.");
  pFVar2 = header_file_input;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.box_ = '\a';
  (pFVar2->super_Fl_Input_).super_Fl_Widget.when_ = '\x01';
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.callback_ = header_input_cb;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.user_data_ = &DAT_00000001;
  pFVar7 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar7,0x77,0x80,0xfc,0x14,"Code File:");
  code_file_input = (Fl_Input *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"The name of the generated code file.");
  pFVar2 = code_file_input;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.box_ = '\a';
  (pFVar2->super_Fl_Input_).super_Fl_Widget.when_ = '\x01';
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.callback_ = code_input_cb;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.user_data_ = &DAT_00000001;
  pFVar7 = (Fl_Widget *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar7,0x75,0x99,0x110,0x14,"Include Header from Code");
  include_H_from_C_button = (Fl_Check_Button *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"Include the header file from the code file.");
  pFVar3 = include_H_from_C_button;
  (include_H_from_C_button->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar3->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       include_H_from_C_button_cb;
  pFVar7 = (Fl_Widget *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar7,0x75,0xb0,0x110,0x14,"Menu shortcuts use FL_COMMAND");
  use_FL_COMMAND_button = (Fl_Check_Button *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"Replace FL_CTRL with FL_COMMAND when generating menu shortcut code.");
  pFVar3 = use_FL_COMMAND_button;
  (use_FL_COMMAND_button->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar3->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       use_FL_COMMAND_button_cb;
  Fl_Group::end(pFVar6);
  pFVar6 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar6,10,0x24,0x17a,0xa9,"Internationalization");
  pFVar7 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar7,100,0x30,0x88,0x19,"Use:");
  i18n_type_chooser = (Fl_Choice *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"Type of internationalization to use.");
  this = i18n_type_chooser;
  (i18n_type_chooser->super_Fl_Menu_).super_Fl_Widget.box_ = '\x06';
  (this->super_Fl_Menu_).down_box_ = '\x0e';
  (this->super_Fl_Menu_).super_Fl_Widget.label_.font = 1;
  (this->super_Fl_Menu_).super_Fl_Widget.callback_ = i18n_type_cb;
  Fl_Menu_::menu(&this->super_Fl_Menu_,menu_i18n_type_chooser);
  pFVar7 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar7,100,0x4e,0x110,0x14,"#include:");
  i18n_include_input = (Fl_Input *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"The include file for internationalization.");
  pFVar2 = i18n_include_input;
  (i18n_include_input->super_Fl_Input_).super_Fl_Widget.box_ = '\a';
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.callback_ = i18n_text_cb;
  pFVar7 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar7,100,0x68,0x110,0x14,"File:");
  i18n_file_input = (Fl_Input *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"The name of the message catalog.");
  pFVar2 = i18n_file_input;
  (i18n_file_input->super_Fl_Input_).super_Fl_Widget.box_ = '\a';
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.callback_ = i18n_text_cb;
  pFVar7 = (Fl_Widget *)operator_new(200);
  Fl_Int_Input::Fl_Int_Input((Fl_Int_Input *)pFVar7,100,0x80,0x110,0x14,"Set:");
  i18n_set_input = (Fl_Int_Input *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"The message set number.");
  pFVar4 = i18n_set_input;
  (i18n_set_input->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ = '\x02';
  (pFVar4->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_ = '\a';
  (pFVar4->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.label_.font = 1;
  (pFVar4->super_Fl_Input).super_Fl_Input_.textfont_ = 4;
  (pFVar4->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.callback_ = i18n_int_cb;
  pFVar7 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar7,100,0x67,0x110,0x14,"Function:");
  i18n_function_input = (Fl_Input *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"The function to call to internationalize the labels and tooltips.");
  pFVar2 = i18n_function_input;
  (i18n_function_input->super_Fl_Input_).super_Fl_Widget.box_ = '\a';
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.callback_ = i18n_text_cb;
  Fl_Group::end(pFVar6);
  Fl_Group::end((Fl_Group *)this_01);
  pFVar5 = project_window;
  puVar1 = &(project_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  Fl_Group::end((Fl_Group *)pFVar5);
  return project_window;
}

Assistant:

Fl_Double_Window* make_project_window() {
  { project_window = new Fl_Double_Window(399, 252, "Project Settings");
    { Fl_Button* o = new Fl_Button(328, 216, 60, 25, "Close");
      o->tooltip("Close this dialog.");
      o->callback((Fl_Callback*)cb_Close);
    } // Fl_Button* o
    { Fl_Tabs* o = new Fl_Tabs(10, 10, 378, 195);
      o->selection_color((Fl_Color)12);
      { Fl_Group* o = new Fl_Group(10, 36, 378, 169, "Output");
        o->hide();
        { Fl_Box* o = new Fl_Box(20, 49, 340, 49, "Use \"name.ext\" to set a file name or just \".ext\" to set extension.");
          o->align(Fl_Align(132|FL_ALIGN_INSIDE));
        } // Fl_Box* o
        { header_file_input = new Fl_Input(119, 103, 252, 20, "Header File:");
          header_file_input->tooltip("The name of the generated header file.");
          header_file_input->box(FL_THIN_DOWN_BOX);
          header_file_input->labelfont(1);
          header_file_input->textfont(4);
          header_file_input->callback((Fl_Callback*)header_input_cb, (void*)(1));
          header_file_input->when(FL_WHEN_CHANGED);
        } // Fl_Input* header_file_input
        { code_file_input = new Fl_Input(119, 128, 252, 20, "Code File:");
          code_file_input->tooltip("The name of the generated code file.");
          code_file_input->box(FL_THIN_DOWN_BOX);
          code_file_input->labelfont(1);
          code_file_input->textfont(4);
          code_file_input->callback((Fl_Callback*)code_input_cb, (void*)(1));
          code_file_input->when(FL_WHEN_CHANGED);
        } // Fl_Input* code_file_input
        { include_H_from_C_button = new Fl_Check_Button(117, 153, 272, 20, "Include Header from Code");
          include_H_from_C_button->tooltip("Include the header file from the code file.");
          include_H_from_C_button->down_box(FL_DOWN_BOX);
          include_H_from_C_button->callback((Fl_Callback*)include_H_from_C_button_cb);
        } // Fl_Check_Button* include_H_from_C_button
        { use_FL_COMMAND_button = new Fl_Check_Button(117, 176, 272, 20, "Menu shortcuts use FL_COMMAND");
          use_FL_COMMAND_button->tooltip("Replace FL_CTRL with FL_COMMAND when generating menu shortcut code.");
          use_FL_COMMAND_button->down_box(FL_DOWN_BOX);
          use_FL_COMMAND_button->callback((Fl_Callback*)use_FL_COMMAND_button_cb);
        } // Fl_Check_Button* use_FL_COMMAND_button
        o->end();
      } // Fl_Group* o
      { Fl_Group* o = new Fl_Group(10, 36, 378, 169, "Internationalization");
        { i18n_type_chooser = new Fl_Choice(100, 48, 136, 25, "Use:");
          i18n_type_chooser->tooltip("Type of internationalization to use.");
          i18n_type_chooser->box(FL_THIN_UP_BOX);
          i18n_type_chooser->down_box(FL_BORDER_BOX);
          i18n_type_chooser->labelfont(1);
          i18n_type_chooser->callback((Fl_Callback*)i18n_type_cb);
          i18n_type_chooser->menu(menu_i18n_type_chooser);
        } // Fl_Choice* i18n_type_chooser
        { i18n_include_input = new Fl_Input(100, 78, 272, 20, "#include:");
          i18n_include_input->tooltip("The include file for internationalization.");
          i18n_include_input->box(FL_THIN_DOWN_BOX);
          i18n_include_input->labelfont(1);
          i18n_include_input->textfont(4);
          i18n_include_input->callback((Fl_Callback*)i18n_text_cb);
        } // Fl_Input* i18n_include_input
        { i18n_file_input = new Fl_Input(100, 104, 272, 20, "File:");
          i18n_file_input->tooltip("The name of the message catalog.");
          i18n_file_input->box(FL_THIN_DOWN_BOX);
          i18n_file_input->labelfont(1);
          i18n_file_input->textfont(4);
          i18n_file_input->callback((Fl_Callback*)i18n_text_cb);
        } // Fl_Input* i18n_file_input
        { i18n_set_input = new Fl_Int_Input(100, 128, 272, 20, "Set:");
          i18n_set_input->tooltip("The message set number.");
          i18n_set_input->type(2);
          i18n_set_input->box(FL_THIN_DOWN_BOX);
          i18n_set_input->labelfont(1);
          i18n_set_input->textfont(4);
          i18n_set_input->callback((Fl_Callback*)i18n_int_cb);
        } // Fl_Int_Input* i18n_set_input
        { i18n_function_input = new Fl_Input(100, 103, 272, 20, "Function:");
          i18n_function_input->tooltip("The function to call to internationalize the labels and tooltips.");
          i18n_function_input->box(FL_THIN_DOWN_BOX);
          i18n_function_input->labelfont(1);
          i18n_function_input->textfont(4);
          i18n_function_input->callback((Fl_Callback*)i18n_text_cb);
        } // Fl_Input* i18n_function_input
        o->end();
      } // Fl_Group* o
      o->end();
    } // Fl_Tabs* o
    project_window->set_modal();
    project_window->end();
  } // Fl_Double_Window* project_window
  return project_window;
}